

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void showToolTip(QHelpEvent *helpEvent,QWidget *widget,QStyleOptionComplex *opt,
                ComplexControl complexControl,SubControl subControl)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  QMdiSubWindow *pQVar5;
  int extraout_var;
  int in_ECX;
  char *in_RDX;
  QRect *extraout_RDX;
  QWidget *in_RSI;
  QHelpEvent *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QRect rect;
  QString toolTip;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  QRect *rect_00;
  QWidget *in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  QPoint *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x70,in_RDX,in_RSI,0);
  if (iVar3 == 0) {
    if (in_ECX == 8) {
      if (in_R8D == 1) {
        in_R8D = 2;
      }
      else if (in_R8D == 4) {
        in_R8D = 8;
      }
      else if (in_R8D == 2) {
        in_R8D = 0x10;
      }
      else {
        in_R8D = 0;
      }
    }
    if (in_R8D != 0) {
      QString::QString((QString *)0x62abd4);
      iVar3 = in_R8D;
      if (in_R8D == 1) {
        QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,1),1);
        QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                           (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        QString::~QString((QString *)0x62aeaa);
      }
      else if (in_R8D == 2) {
        QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,2),2);
        QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                           (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        QString::~QString((QString *)0x62ac90);
      }
      else if (in_R8D == 4) {
        QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,4),4);
        QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                           (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        QString::~QString((QString *)0x62acd4);
      }
      else if (in_R8D == 8) {
        QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,8),8);
        QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                           (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        QString::~QString((QString *)0x62ae3a);
      }
      else if (in_R8D == 0x10) {
        bVar2 = QWidget::isMaximized(in_RSI);
        if ((bVar2) ||
           (pQVar5 = qobject_cast<QMdiSubWindow*>((QObject *)0x62ad79),
           pQVar5 == (QMdiSubWindow *)0x0)) {
          QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,iVar3),in_R8D);
          QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                             (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
          QString::~QString((QString *)0x62adbe);
        }
        else {
          QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,iVar3),in_R8D);
          QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                             (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
          QString::~QString((QString *)0x62adff);
        }
      }
      else if (in_R8D == 0x20) {
        QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,0x20),0x20);
        QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                           (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        QString::~QString((QString *)0x62ad5c);
      }
      else if (in_R8D == 0x40) {
        QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,0x40),0x40);
        QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                           (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        QString::~QString((QString *)0x62ad18);
      }
      else if (in_R8D == 0x80) {
        QMdiSubWindow::tr(in_RDX,(char *)CONCAT44(in_ECX,0x80),0x80);
        QString::operator=((QString *)CONCAT44(in_ECX,iVar3),
                           (QString *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        QString::~QString((QString *)0x62ae72);
      }
      pQVar4 = QWidget::style((QWidget *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
      (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,in_ECX,in_RDX,iVar3,in_RSI);
      rect_00 = extraout_RDX;
      iVar3 = extraout_var;
      QHelpEvent::globalPos(in_RDI);
      QToolTip::showText(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,rect_00,iVar3);
      QString::~QString((QString *)0x62af2f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void showToolTip(QHelpEvent *helpEvent, QWidget *widget, const QStyleOptionComplex &opt,
                        QStyle::ComplexControl complexControl, QStyle::SubControl subControl)
{
    Q_ASSERT(helpEvent);
    Q_ASSERT(helpEvent->type() == QEvent::ToolTip);
    Q_ASSERT(widget);

    if (widget->style()->styleHint(QStyle::SH_TitleBar_ShowToolTipsOnButtons, &opt, widget))
        return;

    // Convert CC_MdiControls to CC_TitleBar. Sub controls of different complex
    // controls cannot be in the same switch as they might have the same value.
    if (complexControl == QStyle::CC_MdiControls) {
        if (subControl == QStyle::SC_MdiMinButton)
            subControl = QStyle::SC_TitleBarMinButton;
        else if (subControl == QStyle::SC_MdiCloseButton)
            subControl = QStyle::SC_TitleBarCloseButton;
        else if (subControl == QStyle::SC_MdiNormalButton)
            subControl = QStyle::SC_TitleBarNormalButton;
        else
            subControl = QStyle::SC_None;
    }

    // Don't change the tooltip for the base widget itself.
    if (subControl == QStyle::SC_None)
        return;

    QString toolTip;

    switch (subControl) {
    case QStyle::SC_TitleBarMinButton:
        toolTip = QMdiSubWindow::tr("Minimize");
        break;
    case QStyle::SC_TitleBarMaxButton:
        toolTip = QMdiSubWindow::tr("Maximize");
        break;
    case QStyle::SC_TitleBarUnshadeButton:
        toolTip = QMdiSubWindow::tr("Unshade");
        break;
    case QStyle::SC_TitleBarShadeButton:
        toolTip = QMdiSubWindow::tr("Shade");
        break;
    case QStyle::SC_TitleBarNormalButton:
        if (widget->isMaximized() || !qobject_cast<QMdiSubWindow *>(widget))
            toolTip = QMdiSubWindow::tr("Restore Down");
        else
            toolTip = QMdiSubWindow::tr("Restore");
        break;
    case QStyle::SC_TitleBarCloseButton:
        toolTip = QMdiSubWindow::tr("Close");
        break;
    case QStyle::SC_TitleBarContextHelpButton:
        toolTip = QMdiSubWindow::tr("Help");
        break;
    case QStyle::SC_TitleBarSysMenu:
        toolTip = QMdiSubWindow::tr("Menu");
        break;
    default:
        break;
    }

    const QRect rect = widget->style()->subControlRect(complexControl, &opt, subControl, widget);
    QToolTip::showText(helpEvent->globalPos(), toolTip, widget, rect);
}